

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mainwindow.cpp
# Opt level: O2

void __thiscall MainWindow::MainWindow(MainWindow *this,QWidget *parent)

{
  Ui_MainWindow *this_00;
  undefined1 local_20 [16];
  
  QMainWindow::QMainWindow(&this->super_QMainWindow,parent,0);
  *(undefined ***)this = &PTR_metaObject_0010ea80;
  *(undefined ***)&this->field_0x10 = &PTR__MainWindow_0010ec38;
  this_00 = (Ui_MainWindow *)operator_new(0x70);
  this->ui = (MainWindow *)this_00;
  Ui_MainWindow::setupUi(this_00,&this->super_QMainWindow);
  QObject::connect<void(QAbstractButton::*)(bool),void(GameBoard::*)()>
            ((Object *)(local_20 + 8),*(offset_in_QAbstractButton_to_subr *)(this->ui + 0x10),
             (Object *)QAbstractButton::clicked,0,(ConnectionType)*(undefined8 *)(this->ui + 0x58));
  QMetaObject::Connection::~Connection((Connection *)(local_20 + 8));
  QObject::connect<void(GameBoard::*)(int),void(MainWindow::*)(int)>
            ((Object *)local_20,*(offset_in_GameBoard_to_subr *)(this->ui + 0x58),
             (Object *)GameBoard::gameOver,0,(ConnectionType)this);
  QMetaObject::Connection::~Connection((Connection *)local_20);
  GameBoard::init(*(GameBoard **)(this->ui + 0x58),(EVP_PKEY_CTX *)0x3);
  return;
}

Assistant:

MainWindow::MainWindow(QWidget *parent)
    : QMainWindow(parent)
    , ui(new Ui::MainWindow)
{
    ui->setupUi(this);

    bool use_dialog = false; //production mode command to avoid having to use the dialog every time app is started
    if(use_dialog)
    {
        InitGameDialog dialog(this);
        if(dialog.exec() == QDialog::Rejected)
            return; //Rejected happens if user presses cancel

        ui->player1Label->setText(dialog.player1Name());
        ui->player2Label->setText(dialog.player2Name());
        ui->gameBoard->init(dialog.boardWidth());

        connect(ui->beginNewGameButton, &QPushButton::clicked, ui->gameBoard, &GameBoard::beginNewGame);
        connect(ui->gameBoard, &GameBoard::gameOver, this, &MainWindow::handleGameOver);
    }
    else // production mode
    {
        connect(ui->beginNewGameButton, &QPushButton::clicked, ui->gameBoard, &GameBoard::beginNewGame);
        connect(ui->gameBoard, &GameBoard::gameOver, this, &MainWindow::handleGameOver);
        ui->gameBoard->init(3);
    }

}